

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::ArchiveShellCommand::getVerboseDescription
          (ArchiveShellCommand *this,SmallVectorImpl<char> *result)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer Str;
  raw_svector_ostream stream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  raw_svector_ostream local_50;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&local_50,result);
  (anonymous_namespace)::ArchiveShellCommand::getArgs_abi_cxx11_(&local_68,this);
  bVar1 = true;
  for (Str = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      Str != local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; Str = Str + 1) {
    if (!bVar1) {
      llvm::raw_ostream::operator<<((raw_ostream *)&local_50," ");
    }
    llvm::raw_ostream::operator<<((raw_ostream *)&local_50,Str);
    bVar1 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream stream(result);
    bool first = true;
    for (const auto& arg: getArgs()) {
      if (!first) {
        stream << " ";
      }
      first = false;
      stream << arg;
    }
  }